

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_string.c
# Opt level: O0

void add_s(MatchState *ms,luaL_Buffer *b,char *s,char *e)

{
  char cVar1;
  char *s_00;
  char *pcVar2;
  undefined8 *in_RSI;
  char *news;
  size_t i;
  size_t l;
  char *in_stack_ffffffffffffffb8;
  undefined6 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc6;
  undefined1 in_stack_ffffffffffffffc7;
  undefined8 in_stack_ffffffffffffffc8;
  lua_State *in_stack_ffffffffffffffd0;
  luaL_Buffer *B;
  luaL_Buffer *local_28;
  
  s_00 = lua_tolstring(in_stack_ffffffffffffffd0,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
                       (size_t *)
                       CONCAT17(in_stack_ffffffffffffffc7,
                                CONCAT16(in_stack_ffffffffffffffc6,in_stack_ffffffffffffffc0)));
  for (B = (luaL_Buffer *)0x0; B < local_28; B = (luaL_Buffer *)((long)&B->p + 1)) {
    if (s_00[(long)B] == '%') {
      B = (luaL_Buffer *)((long)&B->p + 1);
      if ((""[(ulong)(byte)s_00[(long)B] + 1] & 8) == 0) {
        in_stack_ffffffffffffffc6 = true;
        if (in_RSI + 0x403 <= (undefined8 *)*in_RSI) {
          pcVar2 = luaL_prepbuffer((luaL_Buffer *)0x130912);
          in_stack_ffffffffffffffc6 = pcVar2 != (char *)0x0;
        }
        cVar1 = s_00[(long)B];
        pcVar2 = (char *)*in_RSI;
        *in_RSI = pcVar2 + 1;
        *pcVar2 = cVar1;
      }
      else if (s_00[(long)B] == '0') {
        luaL_addlstring(B,s_00,CONCAT17(in_stack_ffffffffffffffc7,
                                        CONCAT16(in_stack_ffffffffffffffc6,in_stack_ffffffffffffffc0
                                                )));
      }
      else {
        push_onecapture((MatchState *)B,(int)((ulong)s_00 >> 0x20),
                        (char *)CONCAT17(in_stack_ffffffffffffffc7,
                                         CONCAT16(in_stack_ffffffffffffffc6,
                                                  in_stack_ffffffffffffffc0)),
                        in_stack_ffffffffffffffb8);
        luaL_addvalue(B);
      }
    }
    else {
      in_stack_ffffffffffffffc7 = true;
      if (in_RSI + 0x403 <= (undefined8 *)*in_RSI) {
        pcVar2 = luaL_prepbuffer((luaL_Buffer *)0x13087e);
        in_stack_ffffffffffffffc7 = pcVar2 != (char *)0x0;
      }
      cVar1 = s_00[(long)B];
      pcVar2 = (char *)*in_RSI;
      *in_RSI = pcVar2 + 1;
      *pcVar2 = cVar1;
    }
  }
  return;
}

Assistant:

static void add_s(MatchState *ms, luaL_Buffer *b, const char *s, const char *e)
{
  size_t l, i;
  const char *news = lua_tolstring(ms->L, 3, &l);
  for (i = 0; i < l; i++) {
    if (news[i] != L_ESC) {
      luaL_addchar(b, news[i]);
    } else {
      i++;  /* skip ESC */
      if (!lj_char_isdigit(uchar(news[i]))) {
	luaL_addchar(b, news[i]);
      } else if (news[i] == '0') {
	luaL_addlstring(b, s, (size_t)(e - s));
      } else {
	push_onecapture(ms, news[i] - '1', s, e);
	luaL_addvalue(b);  /* add capture to accumulated result */
      }
    }
  }
}